

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

int __thiscall cmGlobalGenerator::GetLinkerPreference(cmGlobalGenerator *this,string *lang)

{
  _Rb_tree_color _Var1;
  const_iterator cVar2;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LanguageToLinkerPreference)._M_t,lang);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header) {
    _Var1 = _S_red;
  }
  else {
    _Var1 = cVar2._M_node[2]._M_color;
  }
  return _Var1;
}

Assistant:

int cmGlobalGenerator::GetLinkerPreference(const std::string& lang) const
{
  std::map<std::string, int>::const_iterator it =
                                   this->LanguageToLinkerPreference.find(lang);
  if (it != this->LanguageToLinkerPreference.end())
    {
    return it->second;
    }
  return 0;
}